

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_color_pick(nk_context *ctx,nk_color *color,nk_color_format fmt)

{
  float fVar1;
  nk_vec2 nVar2;
  nk_color right;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_user_font *pnVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  nk_widget_layout_states nVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  nk_color nVar13;
  void *pvVar14;
  undefined2 uVar15;
  nk_color left;
  nk_command_buffer *b;
  nk_flags *state;
  nk_context *i;
  long lVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  nk_rect r;
  nk_rect r_00;
  nk_rect r_01;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  float hsva [4];
  float a;
  nk_rect bounds;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  nk_color_format local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  nk_rect local_b8;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  float local_5c;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  nk_rect local_40;
  
  local_10c = fmt;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5491,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  if (color == (nk_color *)0x0) {
    __assert_fail("color",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5492,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  pnVar3 = ctx->current;
  if (pnVar3 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5493,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  pnVar4 = pnVar3->layout;
  if (pnVar4 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5494,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  nVar8 = nk_widget(&local_40,ctx);
  if (nVar8 == NK_WIDGET_INVALID) {
    return 0;
  }
  i = (nk_context *)0x0;
  if ((nVar8 != NK_WIDGET_ROM) && ((pnVar4->flags & 0x1000) == 0)) {
    i = ctx;
  }
  pnVar5 = (ctx->style).font;
  if (pnVar5 == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4028,
                  "int nk_do_color_picker(nk_flags *, struct nk_command_buffer *, struct nk_color *, enum nk_color_format, struct nk_rect, struct nk_vec2, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  state = &ctx->last_widget_state;
  local_d8 = local_40.h;
  fVar18 = pnVar5->height;
  local_88 = ZEXT416((uint)fVar18);
  local_b8.x = local_40.x;
  local_b8.y = local_40.y;
  local_b8.w = 0.0;
  local_b8.h = 0.0;
  fVar22 = local_40.x + 0.0;
  local_128._4_4_ = local_40.y + 0.0;
  fVar17 = fVar18 + fVar18 + 0.0;
  local_c8._0_4_ = local_40.w - fVar17;
  register0x00001244 = (ulong)local_40._8_8_ >> 0x20;
  fStack_bc = 0.0;
  local_78 = CONCAT44(local_d8,local_40.w - fVar17);
  uStack_70 = 0;
  local_f8._0_4_ = local_40.w;
  local_f8._4_4_ = local_40.h;
  uStack_f0 = 0;
  local_98._4_4_ = local_d8;
  local_98._0_4_ = fVar18;
  local_98._8_8_ = 0;
  local_108 = CONCAT44(local_128._4_4_,fVar22);
  uStack_100 = 0;
  local_e8 = CONCAT44(local_128._4_4_,fVar22 + (float)local_c8._0_4_);
  uStack_e0 = 0;
  local_128._0_4_ = fVar22 + (float)local_c8._0_4_;
  _fStack_120 = 0;
  fStack_d4 = local_d8;
  fStack_d0 = local_d8;
  fStack_cc = local_d8;
  nk_color_hsva_f(&local_138,&local_134,&local_130,&local_12c,*color);
  r.w = (float)(undefined4)local_78;
  r.h = (float)local_78._4_4_;
  r.x = (float)local_108;
  r.y = local_108._4_4_;
  iVar9 = nk_button_behavior(state,r,&i->input,NK_BUTTON_REPEATER);
  auVar7 = local_98;
  auVar6 = _local_128;
  if (iVar9 == 0) {
    iVar9 = 0;
  }
  else {
    auVar20._0_4_ = (float)local_c8._0_4_ + -1.0;
    auVar20._4_4_ = local_f8._4_4_ + -1.0;
    auVar20._8_4_ = (float)uStack_f0 + 0.0;
    auVar20._12_4_ = uStack_f0._4_4_ + 0.0;
    nVar2 = (i->input).mouse.pos;
    auVar19._0_4_ = nVar2.x - (float)local_108;
    auVar19._4_4_ = nVar2.y - local_108._4_4_;
    auVar19._8_4_ = 0.0 - (float)uStack_100;
    auVar19._12_4_ = 0.0 - uStack_100._4_4_;
    auVar19 = divps(auVar19,auVar20);
    fVar18 = auVar19._4_4_;
    auVar21._4_4_ = -(uint)(0.0 < auVar19._0_4_);
    auVar21._0_4_ = -(uint)(0.0 < fVar18);
    auVar21._8_4_ = -(uint)(1.0 < fVar18);
    auVar21._12_4_ = -(uint)(1.0 < auVar19._0_4_);
    uVar10 = movmskps(iVar9,auVar21);
    local_134 = 1.0;
    fVar17 = local_134;
    if ((uVar10 & 1) == 0) {
      fVar17 = 0.0;
    }
    local_130 = 1.0;
    if ((uVar10 & 4) == 0) {
      local_130 = fVar17;
    }
    if ((uVar10 & 1) == 0) {
      fVar18 = local_130;
    }
    if ((uVar10 & 4) == 0) {
      local_130 = fVar18;
    }
    if ((uVar10 & 10) == 0) {
      local_134 = 0.0;
    }
    if ((uVar10 & 2) == 0) {
      auVar19 = ZEXT416((uint)local_134);
    }
    if ((uVar10 & 8) == 0) {
      local_134 = auVar19._0_4_;
    }
    local_130 = 1.0 - local_130;
    iVar9 = 1;
  }
  local_a8 = (float)local_88._0_4_ + (float)local_e8;
  uStack_a4 = local_88._4_4_;
  uStack_a0 = local_88._8_4_;
  uStack_9c = local_88._12_4_;
  r_00.w = (float)local_98._0_4_;
  r_00.h = (float)local_98._4_4_;
  r_00.x = (float)local_128._0_4_;
  r_00.y = (float)local_128._4_4_;
  _local_128 = auVar6;
  local_98 = auVar7;
  iVar11 = nk_button_behavior(state,r_00,&i->input,NK_BUTTON_REPEATER);
  auVar6 = local_98;
  if (iVar11 != 0) {
    fVar17 = ((i->input).mouse.pos.y - local_108._4_4_) / (local_d8 + -1.0);
    local_138 = (float)(-(uint)(1.0 < fVar17) & 0x3f800000 |
                       ~-(uint)(1.0 < fVar17) & -(uint)(0.0 < fVar17) & 0x3f800000);
    fVar18 = fVar17;
    if (fVar17 <= 0.0) {
      fVar18 = local_138;
    }
    if (fVar17 <= 1.0) {
      local_138 = fVar18;
    }
    iVar9 = 1;
  }
  local_58 = local_a8;
  fStack_54 = local_108._4_4_;
  uStack_50 = (float)uStack_100;
  uStack_4c = uStack_100._4_4_;
  local_128._4_4_ = local_108._4_4_;
  local_128._0_4_ = local_108._4_4_;
  fStack_120 = local_108._4_4_;
  fStack_11c = local_108._4_4_;
  iVar11 = iVar9;
  if (local_10c == NK_RGBA) {
    r_01.y = local_108._4_4_;
    r_01.x = local_a8;
    r_01.w = (float)local_98._0_4_;
    r_01.h = (float)local_98._4_4_;
    local_98 = auVar6;
    iVar12 = nk_button_behavior(state,r_01,&i->input,NK_BUTTON_REPEATER);
    if (iVar12 != 0) {
      fVar17 = ((i->input).mouse.pos.y - (float)local_128._0_4_) / (local_d8 + -1.0);
      local_12c = (float)(-(uint)(1.0 < fVar17) & 0x3f800000 |
                         ~-(uint)(1.0 < fVar17) & -(uint)(0.0 < fVar17) & 0x3f800000);
      fVar18 = fVar17;
      if (fVar17 <= 0.0) {
        fVar18 = local_12c;
      }
      if (fVar17 <= 1.0) {
        local_12c = fVar18;
      }
      local_12c = 1.0 - local_12c;
      iVar11 = 1;
    }
  }
  uVar10 = *state & 2 | 4;
  *state = uVar10;
  fVar18 = (float)local_108;
  fVar17 = local_108._4_4_;
  if (iVar9 != 0) {
    nVar13 = nk_hsva_f(local_138,local_134,local_130,local_12c);
    *color = nVar13;
    *state = 0x22;
    uVar10 = 0x22;
    fVar18 = (float)local_108;
    fVar17 = local_108._4_4_;
  }
  if (iVar11 != 0) {
    color->a = (nk_byte)(int)(local_12c * 255.0);
    *state = 0x22;
    uVar10 = 0x22;
  }
  if (i == (nk_context *)0x0) goto LAB_00138d26;
  fVar22 = (i->input).mouse.pos.x;
  fVar18 = (float)local_f8 + fVar18;
  if ((((fVar22 < local_b8.x) || (fVar18 <= fVar22)) ||
      (fVar22 = (i->input).mouse.pos.y, fVar22 < local_b8.y)) || (local_f8._4_4_ + fVar17 <= fVar22)
     ) {
    fVar22 = (i->input).mouse.prev.x;
LAB_00138cee:
    if (((fVar22 < local_b8.x) || (fVar18 <= fVar22)) ||
       ((fVar18 = (i->input).mouse.prev.y, fVar18 < local_b8.y ||
        (local_f8._4_4_ + fVar17 <= fVar18)))) goto LAB_00138d26;
    uVar10 = uVar10 | 0x40;
  }
  else {
    *state = 0x12;
    uVar10 = 0x12;
    fVar22 = (i->input).mouse.prev.x;
    if (((local_b8.x <= fVar22) && (fVar22 < fVar18)) &&
       ((fVar1 = (i->input).mouse.prev.y, local_b8.y <= fVar1 && (fVar1 < local_f8._4_4_ + fVar17)))
       ) goto LAB_00138cee;
    uVar10 = 0x1a;
  }
  *state = uVar10;
LAB_00138d26:
  b = &pnVar3->buffer;
  nVar13 = *color;
  nk_color_hsva_f(&local_138,&local_134,&local_130,&local_5c,nVar13);
  local_b8.y = local_d8 / 6.0 + 0.5;
  local_b8.x = (float)local_88._0_4_;
  local_b8._8_8_ = local_88._8_8_;
  left.r = 0xff;
  left.g = '\0';
  left.b = '\0';
  left.a = 0xff;
  lVar16 = 0;
  local_f8._0_4_ = local_d8 / 6.0;
  do {
    iVar9 = (int)lVar16;
    right = *(nk_color *)(nk_draw_color_picker_hue_colors + lVar16 * 4 + 4);
    lVar16 = lVar16 + 1;
    rect.y = (float)iVar9 * (float)local_f8 + (float)local_128._0_4_ + 0.5;
    rect.x = (float)local_e8;
    rect.w = local_b8.x;
    rect.h = local_b8.y;
    nk_fill_rect_multi_color(b,rect,left,left,right,right);
    left = right;
  } while (lVar16 != 6);
  local_f8 = CONCAT44(local_f8._4_4_,local_138);
  pvVar14 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
  auVar6 = local_98;
  if (pvVar14 != (void *)0x0) {
    *(undefined2 *)((long)pvVar14 + 0x10) = 1;
    *(short *)((long)pvVar14 + 0x12) = (short)(int)((float)local_e8 + -1.0);
    uVar15 = (undefined2)(int)((float)local_f8 * local_d8 + (float)local_128._0_4_ + 0.5);
    *(undefined2 *)((long)pvVar14 + 0x14) = uVar15;
    *(short *)((long)pvVar14 + 0x16) = (short)(int)(local_a8 + 2.0);
    *(undefined2 *)((long)pvVar14 + 0x18) = uVar15;
    *(undefined4 *)((long)pvVar14 + 0x1a) = 0xffffffff;
  }
  if (local_10c == NK_RGBA) {
    rect_00.y = fStack_54;
    rect_00.x = local_58;
    rect_00.w = (float)local_98._0_4_;
    rect_00.h = (float)local_98._4_4_;
    local_98 = auVar6;
    nk_fill_rect_multi_color
              (b,rect_00,(nk_color)0xffffffff,(nk_color)0xffffffff,(nk_color)0xff000000,
               (nk_color)0xff000000);
    pvVar14 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
    if (pvVar14 != (void *)0x0) {
      fVar17 = (float)((uint)nVar13 >> 0x18) / 255.0;
      fVar18 = 1.0;
      if (fVar17 <= 1.0) {
        fVar18 = fVar17;
      }
      if (fVar18 <= 0.0) {
        fVar18 = 0.0;
      }
      *(undefined2 *)((long)pvVar14 + 0x10) = 1;
      *(short *)((long)pvVar14 + 0x12) = (short)(int)(local_a8 + -1.0);
      uVar15 = (undefined2)(int)((1.0 - fVar18) * local_d8 + (float)local_128._0_4_ + 0.5);
      *(undefined2 *)((long)pvVar14 + 0x14) = uVar15;
      *(short *)((long)pvVar14 + 0x16) = (short)(int)((float)local_88._0_4_ + local_a8 + 2.0);
      *(undefined2 *)((long)pvVar14 + 0x18) = uVar15;
      *(undefined4 *)((long)pvVar14 + 0x1a) = 0xffffffff;
    }
  }
  nVar13 = nk_hsva_f((float)local_f8,1.0,1.0,1.0);
  rect_01.w = (float)(undefined4)local_78;
  rect_01.h = (float)local_78._4_4_;
  rect_01.x = (float)local_108;
  rect_01.y = local_108._4_4_;
  nk_fill_rect_multi_color(b,rect_01,(nk_color)0xffffffff,nVar13,nVar13,(nk_color)0xffffffff);
  rect_02.w = (float)(undefined4)local_78;
  rect_02.h = (float)local_78._4_4_;
  rect_02.x = (float)local_108;
  rect_02.y = local_108._4_4_;
  nk_fill_rect_multi_color
            (b,rect_02,(nk_color)0x0,(nk_color)0x0,(nk_color)0xff000000,(nk_color)0xff000000);
  local_c8._0_4_ = (float)local_c8._0_4_ * local_134 + (float)local_108;
  local_e8 = CONCAT44((float)(int)(float)local_c8._4_4_,(float)(int)(float)local_c8._0_4_);
  uStack_e0 = CONCAT44((float)(int)fStack_bc,(float)(int)fStack_c0);
  fVar18 = (1.0 - local_130) * local_d8 + (float)local_128._0_4_;
  _local_128 = ZEXT416((uint)(int)fVar18);
  pvVar14 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
  uVar15 = (undefined2)(int)fVar18;
  if (pvVar14 != (void *)0x0) {
    *(undefined2 *)((long)pvVar14 + 0x10) = 1;
    *(short *)((long)pvVar14 + 0x12) = (short)(int)((float)local_e8 + -7.0);
    *(undefined2 *)((long)pvVar14 + 0x14) = uVar15;
    *(short *)((long)pvVar14 + 0x16) = (short)(int)((float)local_e8 + -2.0);
    *(undefined2 *)((long)pvVar14 + 0x18) = uVar15;
    *(undefined4 *)((long)pvVar14 + 0x1a) = 0xffffffff;
  }
  local_128._4_4_ = (float)(int)local_128._4_4_;
  local_128._0_4_ = (float)(int)local_128._0_4_;
  fStack_120 = (float)(int)fStack_120;
  fStack_11c = (float)(int)fStack_11c;
  pvVar14 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
  if (pvVar14 != (void *)0x0) {
    *(undefined2 *)((long)pvVar14 + 0x10) = 1;
    *(short *)((long)pvVar14 + 0x12) = (short)(int)((float)local_e8 + 7.0 + 1.0);
    *(undefined2 *)((long)pvVar14 + 0x14) = uVar15;
    *(short *)((long)pvVar14 + 0x16) = (short)(int)((float)local_e8 + 3.0);
    *(undefined2 *)((long)pvVar14 + 0x18) = uVar15;
    *(undefined4 *)((long)pvVar14 + 0x1a) = 0xffffffff;
  }
  iVar9 = (int)(float)local_c8._0_4_;
  pvVar14 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
  uVar15 = (undefined2)iVar9;
  if (pvVar14 != (void *)0x0) {
    *(undefined2 *)((long)pvVar14 + 0x10) = 1;
    *(undefined2 *)((long)pvVar14 + 0x12) = uVar15;
    *(short *)((long)pvVar14 + 0x14) = (short)(int)((float)local_128._0_4_ + 7.0 + 1.0);
    *(undefined2 *)((long)pvVar14 + 0x16) = uVar15;
    *(short *)((long)pvVar14 + 0x18) = (short)(int)((float)local_128._0_4_ + 3.0);
    *(undefined4 *)((long)pvVar14 + 0x1a) = 0xffffffff;
  }
  pvVar14 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
  if (pvVar14 != (void *)0x0) {
    *(undefined2 *)((long)pvVar14 + 0x10) = 1;
    *(undefined2 *)((long)pvVar14 + 0x12) = uVar15;
    *(short *)((long)pvVar14 + 0x14) = (short)(int)((float)local_128._0_4_ + -7.0);
    *(undefined2 *)((long)pvVar14 + 0x16) = uVar15;
    *(short *)((long)pvVar14 + 0x18) = (short)(int)((float)local_128._0_4_ + -2.0);
    *(undefined4 *)((long)pvVar14 + 0x1a) = 0xffffffff;
  }
  return iVar11;
}

Assistant:

NK_API int
nk_color_pick(struct nk_context * ctx, struct nk_color *color,
    enum nk_color_format fmt)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *config;
    const struct nk_input *in;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(color);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !color)
        return 0;

    win = ctx->current;
    config = &ctx->style;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_color_picker(&ctx->last_widget_state, &win->buffer, color, fmt, bounds,
                nk_vec2(0,0), in, config->font);
}